

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O2

void __thiscall IR::MultiBranchInstr::MultiBranchInstr(MultiBranchInstr *this)

{
  BranchInstr::BranchInstr(&this->super_BranchInstr,false);
  (this->super_BranchInstr).super_Instr._vptr_Instr = (_func_int **)&PTR_Dump_01372330;
  this->m_branchTargets = (void *)0x0;
  this->m_kind = IntJumpTable;
  this->m_baseCaseValue = 0;
  this->m_lastCaseValue = 0;
  (this->super_BranchInstr).m_isMultiBranch = true;
  return;
}

Assistant:

MultiBranchInstr() :
        m_branchTargets(nullptr),
        m_kind(IntJumpTable),
        m_baseCaseValue(0),
        m_lastCaseValue(0)
    {
#if DBG
        m_isMultiBranch = true;
#endif
    }